

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

Fiber * fiber_init(Fiber *fbr,void *stack,size_t stack_size,FiberCleanupFunc cleanup,void *arg)

{
  undefined8 *in_RAX;
  FiberGuardArgs *args;
  undefined8 *local_28;
  
  fbr->stack = stack;
  fbr->stack_size = stack_size;
  fbr->alloc_stack = (void *)0x0;
  fbr->state = 0;
  (fbr->regs).sp = (void *)0x0;
  (fbr->regs).lr = (void *)0x0;
  (fbr->regs).rbp = (void *)0x0;
  (fbr->regs).rbx = (void *)0x0;
  (fbr->regs).r12 = (void *)0x0;
  (fbr->regs).r13 = (void *)0x0;
  (fbr->regs).r14 = (void *)0x0;
  (fbr->regs).r15 = (void *)0x0;
  (fbr->regs).sp = (void *)((long)stack + (stack_size - 8) & 0xfffffffffffffff0);
  local_28 = in_RAX;
  fiber_reserve_return(fbr,fiber_guard,&local_28,0x18);
  *local_28 = fbr;
  local_28[1] = cleanup;
  local_28[2] = arg;
  *(byte *)&fbr->state = (byte)fbr->state | 4;
  return fbr;
}

Assistant:

Fiber *
fiber_init(Fiber *fbr,
           void *stack,
           size_t stack_size,
           FiberCleanupFunc cleanup,
           void *arg)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    fbr->stack = stack;
    fbr->stack_size = stack_size;
    fbr->alloc_stack = NULL;
    fbr->state = 0;
    fiber_init_(fbr, cleanup, arg);
    return fbr;
}